

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidobjs.c
# Opt level: O2

FT_Error cid_size_request(FT_Size size,FT_Size_Request req)

{
  FT_Error FVar1;
  PSH_Globals_Funcs pPVar2;
  
  FVar1 = FT_Request_Metrics(size->face,req);
  if (FVar1 == 0) {
    pPVar2 = cid_size_get_globals_funcs((CID_Size)size);
    if (pPVar2 != (PSH_Globals_Funcs)0x0) {
      (*pPVar2->set_scale)
                ((PSH_Globals)size->internal->module_data,(size->metrics).x_scale,
                 (size->metrics).y_scale,0,0);
    }
  }
  return FVar1;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cid_size_request( FT_Size          size,
                    FT_Size_Request  req )
  {
    FT_Error  error;

    PSH_Globals_Funcs  funcs;


    error = FT_Request_Metrics( size->face, req );
    if ( error )
      goto Exit;

    funcs = cid_size_get_globals_funcs( (CID_Size)size );

    if ( funcs )
      funcs->set_scale( (PSH_Globals)size->internal->module_data,
                        size->metrics.x_scale,
                        size->metrics.y_scale,
                        0, 0 );

  Exit:
    return error;
  }